

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptorTables * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateFileTables(Tables *this)

{
  FileDescriptorTables *this_00;
  FileDescriptorTables *result;
  FileDescriptorTables *local_20;
  
  this_00 = (FileDescriptorTables *)operator_new(0x1d8);
  FileDescriptorTables::FileDescriptorTables(this_00);
  local_20 = this_00;
  std::
  vector<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>>>
  ::emplace_back<google::protobuf::FileDescriptorTables*&>
            ((vector<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>>>
              *)&this->file_tables_,&local_20);
  return local_20;
}

Assistant:

FileDescriptorTables* DescriptorPool::Tables::AllocateFileTables() {
  FileDescriptorTables* result = new FileDescriptorTables;
  file_tables_.emplace_back(result);
  return result;
}